

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader.cpp
# Opt level: O1

bool __thiscall HttpHeader::addDateField(HttpHeader *this)

{
  bool bVar1;
  time_t t;
  tm tmp;
  char buf [64];
  time_t local_98;
  tm local_90;
  char local_58 [64];
  
  local_98 = time((time_t *)0x0);
  localtime_r(&local_98,&local_90);
  strftime(local_58,0x40,"%a, %b %e %T %Y",&local_90);
  bVar1 = HttpHeaderBase::addField(&this->super_HttpHeaderBase,0x3f9,local_58);
  return bVar1;
}

Assistant:

bool HttpHeader::addDateField()
{
	time_t t = time( NULL );
	struct tm tmp;
	localtime_r(&t, &tmp);

	char buf[64];
	strftime(buf, 64, "%a, %b %e %T %Y", &tmp);
	return addField(HttpFieldMap::kFieldDate, buf);
}